

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filefind.cpp
# Opt level: O0

bool __thiscall Am_Data_Locator::Find_File(Am_Data_Locator *this,Am_Filename *f,Am_Filename *found)

{
  bool bVar1;
  reference dir;
  undefined1 local_58 [8];
  Am_Filename fullname;
  _Self local_30;
  const_iterator it;
  Am_Filename *found_local;
  Am_Filename *f_local;
  Am_Data_Locator *this_local;
  
  it._M_node = (_List_node_base *)found;
  bVar1 = Am_Filename::Is_Relative(f);
  if ((bVar1) || (bVar1 = Am_Filename::Exists(f), !bVar1)) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
         ::begin(&this->search_list);
    while( true ) {
      fullname._24_8_ =
           std::__cxx11::
           list<std::pair<Am_Filename,_unsigned_int>,_std::allocator<std::pair<Am_Filename,_unsigned_int>_>_>
           ::end(&this->search_list);
      bVar1 = std::operator!=(&local_30,(_Self *)&fullname.field_0x18);
      if (!bVar1) break;
      dir = std::_List_const_iterator<std::pair<Am_Filename,_unsigned_int>_>::operator*(&local_30);
      Am_Filename::Am_Filename((Am_Filename *)local_58,&dir->first,f);
      bVar1 = Am_Filename::Exists((Am_Filename *)local_58);
      if (bVar1) {
        Am_Filename::operator=((Am_Filename *)it._M_node,(Am_Filename *)local_58);
        this_local._7_1_ = 1;
      }
      Am_Filename::~Am_Filename((Am_Filename *)local_58);
      if (bVar1) goto LAB_002fa7a9;
      std::_List_const_iterator<std::pair<Am_Filename,_unsigned_int>_>::operator++(&local_30);
    }
    this_local._7_1_ = 0;
  }
  else {
    Am_Filename::operator=((Am_Filename *)it._M_node,f);
    this_local._7_1_ = 1;
  }
LAB_002fa7a9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
Am_Data_Locator::Find_File(const Am_Filename &f, Am_Filename &found) const
{
  if (!(f.Is_Relative()) && f.Exists()) // Checks the filename itself
  {
    found = f;
    return true;
  } else // Try to complete the name with some search directory
  {
    for (dir_list_t::const_iterator it = search_list.begin();
         it != search_list.end(); ++it) {
      const Am_Filename fullname((*it).first, f);
      if (fullname.Exists()) {
        found = fullname;
        return true;
      }
    }
  }
  return false;
}